

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O2

void __thiscall miniros::TransportTCP::setNoDelay(TransportTCP *this,bool nodelay)

{
  int iVar1;
  undefined7 in_register_00000031;
  allocator<char> local_35;
  int flag;
  string local_30;
  
  flag = (int)CONCAT71(in_register_00000031,nodelay);
  iVar1 = setsockopt(this->sock_,6,1,&flag,4);
  if (iVar1 < 0) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (setNoDelay::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"miniros.transport_tcp",&local_35);
      console::initializeLogLocation(&setNoDelay::loc,&local_30,Error);
      std::__cxx11::string::~string((string *)&local_30);
    }
    if (setNoDelay::loc.level_ != Error) {
      console::setLogLocationLevel(&setNoDelay::loc,Error);
      console::checkLogLocationEnabled(&setNoDelay::loc);
    }
    if (setNoDelay::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,setNoDelay::loc.logger_,setNoDelay::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                     ,0xb0,"void miniros::TransportTCP::setNoDelay(bool)",
                     "setsockopt failed to set TCP_NODELAY on socket [%d] [%s]",
                     (ulong)(uint)this->sock_,(this->cached_remote_host_)._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void TransportTCP::setNoDelay(bool nodelay)
{
  int flag = nodelay ? 1 : 0;
  int result = setsockopt(sock_, IPPROTO_TCP, TCP_NODELAY, (char *) &flag, sizeof(int));
  if (result < 0)
  {
    MINIROS_ERROR("setsockopt failed to set TCP_NODELAY on socket [%d] [%s]", sock_, cached_remote_host_.c_str());
  }
}